

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O0

Aig_Man_t * Saig_ManDupFoldConstrsFunc2(Aig_Man_t *pAig,int fCompl,int fVerbose,int typeII_cnt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *c;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *type_II_latch;
  int type_II;
  int typeII_cc;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pFlopIn;
  Aig_Obj_t *pFlopOut;
  Aig_Obj_t *pMiter;
  Aig_Man_t *pAigNew;
  int typeII_cnt_local;
  int fVerbose_local;
  int fCompl_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Aig_ManConstrNum(pAig);
  if (iVar2 == 0) {
    pAig_local = Aig_ManDupDfs(pAig);
  }
  else {
    iVar2 = Aig_ManConstrNum(pAig);
    iVar3 = Saig_ManPoNum(pAig);
    if (iVar3 <= iVar2) {
      __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigUnfold2.c"
                    ,0x17f,"Aig_Man_t *Saig_ManDupFoldConstrsFunc2(Aig_Man_t *, int, int, int)");
    }
    iVar2 = Aig_ManNodeNum(pAig);
    pAig_local = Aig_ManStart(iVar2);
    pcVar5 = Abc_UtilStrsav(pAig->pName);
    pAig_local->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(pAig->pSpec);
    pAig_local->pSpec = pcVar5;
    pAVar6 = Aig_ManConst1(pAig_local);
    pAVar7 = Aig_ManConst1(pAig);
    (pAVar7->field_5).pData = pAVar6;
    for (type_II = 0; iVar2 = Vec_PtrSize(pAig->vCis), type_II < iVar2; type_II = type_II + 1) {
      pvVar8 = Vec_PtrEntry(pAig->vCis,type_II);
      pAVar6 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
    }
    for (type_II = 0; iVar2 = Vec_PtrSize(pAig->vObjs), type_II < iVar2; type_II = type_II + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,type_II);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
        pAVar7 = Aig_ObjChild0Copy(pAVar6);
        pAVar9 = Aig_ObjChild1Copy(pAVar6);
        pAVar7 = Aig_And(pAig_local,pAVar7,pAVar9);
        (pAVar6->field_5).pData = pAVar7;
      }
    }
    pFlopOut = Aig_ManConst0(pAig_local);
    bVar1 = false;
    for (type_II = 0; iVar2 = Saig_ManPoNum(pAig), type_II < iVar2; type_II = type_II + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,type_II);
      iVar2 = Saig_ManPoNum(pAig);
      iVar3 = Aig_ManConstrNum(pAig);
      if (iVar2 - iVar3 <= type_II) {
        iVar2 = Saig_ManPoNum(pAig);
        if (iVar2 <= type_II) {
          bVar1 = true;
        }
        if (bVar1) {
          pAVar7 = Aig_ObjCreateCi(pAig_local);
          pAVar7 = Aig_NotCond(pAVar7,fCompl);
          pAVar9 = Aig_ObjChild0Copy(pAVar6);
          pAVar9 = Aig_NotCond(pAVar9,fCompl);
          pAVar7 = Aig_And(pAig_local,pAVar7,pAVar9);
          pFlopOut = Aig_Or(pAig_local,pFlopOut,pAVar7);
          iVar2 = Aig_IsComplement(pAVar6);
          pcVar5 = "";
          if (iVar2 != 0) {
            pcVar5 = "!";
          }
          pAVar6 = Aig_Regular(pAVar6);
          uVar4 = Aig_ObjId(pAVar6);
          printf("modeling typeII : %d:%s%d \n",(ulong)(uint)type_II,pcVar5,(ulong)uVar4);
        }
        else {
          pAVar6 = Aig_ObjChild0Copy(pAVar6);
          pAVar6 = Aig_NotCond(pAVar6,fCompl);
          pFlopOut = Aig_Or(pAig_local,pFlopOut,pAVar6);
        }
      }
    }
    iVar2 = Saig_ManRegNum(pAig);
    if (iVar2 < 1) {
      pObj = pFlopOut;
    }
    else {
      pAVar6 = Aig_ObjCreateCi(pAig_local);
      pObj = Aig_Or(pAig_local,pFlopOut,pAVar6);
    }
    for (type_II = 0; iVar2 = Saig_ManPoNum(pAig), type_II < iVar2; type_II = type_II + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,type_II);
      iVar2 = Saig_ManPoNum(pAig);
      iVar3 = Aig_ManConstrNum(pAig);
      if (type_II < iVar2 - iVar3) {
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        pAVar7 = Aig_Not(pObj);
        pAVar6 = Aig_And(pAig_local,pAVar6,pAVar7);
        Aig_ObjCreateCo(pAig_local,pAVar6);
      }
    }
    for (type_II = 0; iVar2 = Saig_ManRegNum(pAig), type_II < iVar2; type_II = type_II + 1) {
      pAVar6 = Saig_ManLi(pAig,type_II);
      pAVar7 = Saig_ManLo(pAig,type_II);
      iVar2 = Aig_ManRegNum(pAig);
      if (type_II < iVar2) {
        pAVar9 = Aig_Not(pObj);
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        pAVar6 = Aig_Mux(pAig_local,pAVar9,pAVar6,(Aig_Obj_t *)(pAVar7->field_5).pData);
        Aig_ObjCreateCo(pAig_local,pAVar6);
      }
      else {
        printf("skipping: reg%d\n",(ulong)(uint)type_II);
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        Aig_ObjCreateCo(pAig_local,pAVar6);
      }
    }
    iVar2 = Aig_ManRegNum(pAig);
    Aig_ManSetRegNum(pAig_local,iVar2);
    bVar1 = false;
    for (type_II = 0; iVar2 = Saig_ManPoNum(pAig), type_II < iVar2; type_II = type_II + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,type_II);
      iVar2 = Saig_ManPoNum(pAig);
      iVar3 = Aig_ManConstrNum(pAig);
      if (iVar2 - iVar3 <= type_II) {
        iVar2 = Saig_ManPoNum(pAig);
        if (iVar2 <= type_II) {
          bVar1 = true;
        }
        if (bVar1) {
          pAVar7 = Aig_ObjChild0Copy(pAVar6);
          Aig_ObjCreateCo(pAig_local,pAVar7);
          iVar2 = Aig_ManRegNum(pAig_local);
          Aig_ManSetRegNum(pAig_local,iVar2 + 1);
          iVar2 = Aig_IsComplement(pAVar6);
          pcVar5 = "";
          if (iVar2 != 0) {
            pcVar5 = "!";
          }
          pAVar6 = Aig_Regular(pAVar6);
          uVar4 = Aig_ObjId(pAVar6);
          printf("Latch for typeII : %d:%s%d \n",(ulong)(uint)type_II,pcVar5,(ulong)uVar4);
        }
      }
    }
    iVar2 = Saig_ManRegNum(pAig);
    if (0 < iVar2) {
      Aig_ObjCreateCo(pAig_local,pObj);
      iVar2 = Aig_ManRegNum(pAig_local);
      Aig_ManSetRegNum(pAig_local,iVar2 + 1);
    }
    uVar4 = Aig_ManRegNum(pAig_local);
    printf("#reg after fold2: %d\n",(ulong)uVar4);
    Aig_ManCleanup(pAig_local);
    Aig_ManSeqCleanup(pAig_local);
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc2( Aig_Man_t * pAig, int fCompl, int fVerbose , 
                                         int typeII_cnt)
{
  Aig_Man_t * pAigNew;
  Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
  int i, typeII_cc, type_II;
  if ( Aig_ManConstrNum(pAig) == 0 )
    return Aig_ManDupDfs( pAig );
  assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
  // start the new manager
  pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
  pAigNew->pName = Abc_UtilStrsav( pAig->pName );
  pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
  // map the constant node
  Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
  // create variables for PIs
  Aig_ManForEachCi( pAig, pObj, i )
    pObj->pData = Aig_ObjCreateCi( pAigNew );
  // add internal nodes of this frame
  Aig_ManForEachNode( pAig, pObj, i )
    pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

  // OR the constraint outputs
  pMiter = Aig_ManConst0( pAigNew );
  typeII_cc = 0;//typeII_cnt;
  typeII_cnt = 0;  
  type_II = 0;
    
  Saig_ManForEachPo( pAig, pObj, i )
    {
      
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {

        Aig_Obj_t * type_II_latch
          = Aig_ObjCreateCi(pAigNew); /* will get connected later; */
        pMiter = Aig_Or(pAigNew, pMiter, 
                        Aig_And(pAigNew, 
                                Aig_NotCond(type_II_latch, fCompl),
                                Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) )
                        );
        printf( "modeling typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      } else 
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

  // create additional flop
  if ( Saig_ManRegNum(pAig) > 0 )
    {
      pFlopOut = Aig_ObjCreateCi( pAigNew );
      pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
  else 
    pFlopIn = pMiter;

  // create primary output
  Saig_ManForEachPo( pAig, pObj, i )
    {
      if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
      Aig_ObjCreateCo( pAigNew, pMiter );
    }

  // transfer to register outputs
  {
    /* the same for type I and type II */
    Aig_Obj_t * pObjLi, *pObjLo;

    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )	{
      if( i + typeII_cc < Aig_ManRegNum(pAig)) {
        Aig_Obj_t *c = Aig_Mux(pAigNew, Aig_Not(pFlopIn), 
                               Aig_ObjChild0Copy(pObjLi) ,
                               (Aig_Obj_t*)pObjLo->pData);
        Aig_ObjCreateCo( pAigNew, c);
      } else {
        printf ( "skipping: reg%d\n", i);
        Aig_ObjCreateCo( pAigNew,Aig_ObjChild0Copy(pObjLi));
      }
    }

  }
  if(0)Saig_ManForEachLi( pAig, pObj, i ) {
      Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    }
  Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    
  type_II = 0;
  Saig_ManForEachPo( pAig, pObj, i )
    {
	
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj));
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
        printf( "Latch for typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      }
    }

     
  // create additional flop 

  if ( Saig_ManRegNum(pAig) > 0 )
    {
      Aig_ObjCreateCo( pAigNew, pFlopIn );
      Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
    }
  printf("#reg after fold2: %d\n", Aig_ManRegNum(pAigNew));
  // perform cleanup
  Aig_ManCleanup( pAigNew );
  Aig_ManSeqCleanup( pAigNew );
  return pAigNew;
}